

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

Message * __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageFactory::GetPrototype
          (GeneratedMessageFactory *this,Descriptor *type)

{
  WrappedMutex *__mutex;
  unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::Message_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::Message_*>_>_>
  *collection;
  DescriptorPool *pDVar1;
  second_type pMVar2;
  DescriptorPool *pDVar3;
  second_type table;
  LogMessage *pLVar4;
  LogFinisher local_61;
  Descriptor *type_local;
  LogMessage local_58;
  
  __mutex = &this->mutex_;
  type_local = type;
  std::mutex::lock(&__mutex->mu_);
  collection = &this->type_map_;
  pMVar2 = FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                     (collection,&type_local);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (pMVar2 == (second_type)0x0) {
    pDVar1 = *(DescriptorPool **)(*(long *)(type_local + 0x10) + 0x10);
    pDVar3 = DescriptorPool::generated_pool();
    if (pDVar1 == pDVar3) {
      local_58._0_8_ = *(undefined8 *)**(undefined8 **)(type_local + 0x10);
      table = FindPtrOrNull<std::unordered_map<char_const*,google::protobuf::internal::DescriptorTable_const*,google::protobuf::hash<char_const*>,google::protobuf::streq,std::allocator<std::pair<char_const*const,google::protobuf::internal::DescriptorTable_const*>>>>
                        (&this->file_map_,(first_type *)&local_58);
      if (table != (second_type)0x0) {
        std::mutex::lock(&__mutex->mu_);
        pMVar2 = FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                           (collection,&type_local);
        if (pMVar2 == (second_type)0x0) {
          internal::RegisterFileLevelMetadata(table);
          pMVar2 = FindPtrOrNull<std::unordered_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,std::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                             (collection,&type_local);
          if (pMVar2 == (second_type)0x0) {
            internal::LogMessage::LogMessage
                      (&local_58,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
                       ,0x27c);
            pLVar4 = internal::LogMessage::operator<<
                               (&local_58,"Type appears to be in generated pool but wasn\'t ");
            pLVar4 = internal::LogMessage::operator<<(pLVar4,"registered: ");
            pLVar4 = internal::LogMessage::operator<<(pLVar4,*(string **)(type_local + 8));
            internal::LogFinisher::operator=(&local_61,pLVar4);
            internal::LogMessage::~LogMessage(&local_58);
            pMVar2 = (second_type)0x0;
          }
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return pMVar2;
      }
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/message.cc"
                 ,0x26a);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_58,"File appears to be in generated pool but wasn\'t registered: ")
      ;
      pLVar4 = internal::LogMessage::operator<<
                         (pLVar4,(string *)**(undefined8 **)(type_local + 0x10));
      internal::LogFinisher::operator=(&local_61,pLVar4);
      internal::LogMessage::~LogMessage(&local_58);
    }
    pMVar2 = (second_type)0x0;
  }
  return pMVar2;
}

Assistant:

const Message* GeneratedMessageFactory::GetPrototype(const Descriptor* type) {
  {
    ReaderMutexLock lock(&mutex_);
    const Message* result = FindPtrOrNull(type_map_, type);
    if (result != NULL) return result;
  }

  // If the type is not in the generated pool, then we can't possibly handle
  // it.
  if (type->file()->pool() != DescriptorPool::generated_pool()) return NULL;

  // Apparently the file hasn't been registered yet.  Let's do that now.
  const internal::DescriptorTable* registration_data =
      FindPtrOrNull(file_map_, type->file()->name().c_str());
  if (registration_data == NULL) {
    GOOGLE_LOG(DFATAL) << "File appears to be in generated pool but wasn't "
                   "registered: "
                << type->file()->name();
    return NULL;
  }

  WriterMutexLock lock(&mutex_);

  // Check if another thread preempted us.
  const Message* result = FindPtrOrNull(type_map_, type);
  if (result == NULL) {
    // Nope.  OK, register everything.
    internal::RegisterFileLevelMetadata(registration_data);
    // Should be here now.
    result = FindPtrOrNull(type_map_, type);
  }

  if (result == NULL) {
    GOOGLE_LOG(DFATAL) << "Type appears to be in generated pool but wasn't "
                << "registered: " << type->full_name();
  }

  return result;
}